

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::Formatter::ToString<unsigned_char,void>
          (string *__return_storage_ptr__,Formatter *this,uchar x)

{
  char *pcVar1;
  char local_30 [32];
  
  pcVar1 = FastInt32ToBufferLeft((int32)this,local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_30,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(I x) {
    return StrCat(x);
  }